

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::save_resume_data_failed_alert::save_resume_data_failed_alert
          (save_resume_data_failed_alert *this,stack_allocator *alloc,torrent_handle *h,
          error_code *e)

{
  error_category *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined3 uVar5;
  string local_30;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__save_resume_data_failed_alert_00430fc0;
  bVar4 = e->failed_;
  uVar5 = *(undefined3 *)&e->field_0x5;
  uVar2 = *(undefined4 *)&e->cat_;
  uVar3 = *(undefined4 *)((long)&e->cat_ + 4);
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar4;
  *(undefined3 *)&(this->error).field_0x5 = uVar5;
  *(undefined4 *)&(this->error).cat_ = uVar2;
  *(undefined4 *)((long)&(this->error).cat_ + 4) = uVar3;
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&local_30,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

save_resume_data_failed_alert::save_resume_data_failed_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, error_code const& e)
		: torrent_alert(alloc, h)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, msg(convert_from_native(error.message()))
#endif
	{
	}